

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  byte bVar1;
  uint res_00;
  uint32_t byte;
  uint32_t res;
  uint8_t *ptr;
  unsigned_long *out_local;
  char *p_local;
  
  bVar1 = *p;
  if ((bVar1 & 0x80) == 0) {
    *out = (ulong)(uint)bVar1;
    p_local = p + 1;
  }
  else {
    res_00 = ((byte)p[1] - 1) * 0x80 + (uint)bVar1;
    if ((p[1] & 0x80U) == 0) {
      *out = (ulong)res_00;
      p_local = p + 2;
    }
    else {
      p_local = VarintParseSlow(p,res_00,out);
    }
  }
  return p_local;
}

Assistant:

PROTOBUF_NODISCARD const char* VarintParse(const char* p, T* out) {
  auto ptr = reinterpret_cast<const uint8_t*>(p);
  uint32_t res = ptr[0];
  if (!(res & 0x80)) {
    *out = res;
    return p + 1;
  }
  uint32_t byte = ptr[1];
  res += (byte - 1) << 7;
  if (!(byte & 0x80)) {
    *out = res;
    return p + 2;
  }
  return VarintParseSlow(p, res, out);
}